

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,Privkey *parent_key,Privkey *privkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *this_00;
  string local_80;
  ByteData160 local_60;
  Pubkey local_48;
  
  Privkey::GeneratePubkey(&local_48,parent_key,true);
  HashUtil::Hash160(&local_60,&local_48);
  ByteData160::GetData((ByteData *)&local_80,&local_60);
  ExtPrivkey(this,network_type,(ByteData *)&local_80,privkey,chain_code,depth,child_num);
  if (local_80._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar1 = Privkey::IsValid(parent_key);
  if (bVar1) {
    return;
  }
  local_80._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_80._M_string_length._0_4_ = 0x224;
  local_80.field_2._M_allocated_capacity = (long)"Constructor_ExtPrivkey" + 0xc;
  logger::log<>((CfdSourceLocation *)&local_80,kCfdLogLevelWarning,"invalid privkey.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Failed to privkey. ExtPrivkey invalid privkey.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_80);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const Privkey& parent_key, const Privkey& privkey,
    const ByteData256& chain_code, uint8_t depth, uint32_t child_num)
    : ExtPrivkey(
          network_type,
          HashUtil::Hash160(parent_key.GeneratePubkey()).GetData(), privkey,
          chain_code, depth, child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }
}